

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O3

void update_view(chunk_conflict *c,player *p)

{
  uint32_t *puVar1;
  int *piVar2;
  wchar_t wVar3;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  loc grid_04;
  loc grid_05;
  loc grid_06;
  uint uVar4;
  int iVar5;
  int iVar6;
  _Bool _Var7;
  int iVar9;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  loc lVar15;
  _Bool _Var8;
  wchar_t wVar10;
  wchar_t wVar11;
  square *psVar16;
  loc lVar17;
  monster *mon;
  loc_conflict lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  loc lVar25;
  int iVar26;
  wchar_t wVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  wchar_t x;
  wchar_t y;
  long local_70;
  
  iVar26 = c->height;
  if (0 < iVar26) {
    iVar9 = c->width;
    iVar23 = 0;
    do {
      if (0 < iVar9) {
        iVar26 = 0;
        do {
          lVar15 = (loc)loc(iVar26,iVar23);
          _Var7 = square_isseen(c,lVar15);
          if (_Var7) {
            psVar16 = square(c,lVar15);
            flag_on_dbg(psVar16->info,3,7,"square(c, grid)->info","SQUARE_WASSEEN");
          }
          psVar16 = square(c,lVar15);
          flag_off(psVar16->info,3,6);
          psVar16 = square(c,lVar15);
          flag_off(psVar16->info,3,5);
          psVar16 = square(c,lVar15);
          flag_off(psVar16->info,3,0x15);
          iVar26 = iVar26 + 1;
          iVar9 = c->width;
        } while (iVar26 < iVar9);
        iVar26 = c->height;
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 < iVar26);
  }
  wVar12 = (p->state).cur_light;
  wVar13 = -wVar12;
  if (L'\0' < wVar12) {
    wVar13 = wVar12;
  }
  lVar15.x = (p->grid).x;
  lVar15.y = (p->grid).y;
  wVar10 = square_light(c,lVar15);
  _Var7 = is_daytime();
  if (_Var7) {
    _Var7 = outside();
  }
  else {
    _Var7 = false;
  }
  iVar26 = c->height;
  if (0 < iVar26) {
    uVar19 = (ulong)(uint)c->width;
    local_70 = 0;
    do {
      if (0 < (int)uVar19) {
        lVar31 = 0;
        do {
          lVar15 = (loc)loc((int)lVar31,(int)local_70);
          _Var8 = square_isglow(c,lVar15);
          if (_Var8) {
            iVar26 = 1;
            if ((_Var7 == false) && (_Var8 = square_allowslos(c,lVar15), !_Var8)) {
              lVar17.x = (p->grid).x;
              lVar17.y = (p->grid).y;
              wVar11 = motion_dir(lVar15,lVar17);
              lVar17 = next_grid(lVar15,wVar11);
              _Var8 = loc_eq((loc_conflict)lVar17,(loc_conflict)lVar15);
              if ((!_Var8) &&
                 (((_Var8 = square_allowslos(c,lVar17), !_Var8 ||
                   (_Var8 = square_isroom(c,lVar17), !_Var8)) ||
                  (_Var8 = square_isglow(c,lVar17), !_Var8)))) {
                uVar19 = (ulong)lVar17 & 0xffffffff00000000;
                wVar11 = lVar15.x;
                if (lVar17.x == wVar11) {
                  lVar17 = (loc)((uint)(wVar11 + L'\xffffffff') | uVar19);
                  _Var8 = square_in_bounds(c,lVar17);
                  if (((!_Var8) || (_Var8 = square_allowslos(c,lVar17), !_Var8)) ||
                     ((_Var8 = square_isroom(c,lVar17), !_Var8 ||
                      ((_Var8 = square_isglow(c,lVar17), !_Var8 ||
                       (_Var8 = source_can_light_wall(c,p,(loc_conflict)lVar17,(loc_conflict)lVar15)
                       , !_Var8)))))) {
                    lVar17 = (loc)(uVar19 | (uint)(wVar11 + L'\x01'));
LAB_00129f7a:
                    _Var8 = square_in_bounds(c,lVar17);
                    if (!_Var8) goto LAB_0012a027;
LAB_00129fe3:
                    _Var8 = square_allowslos(c,lVar17);
                    if ((((!_Var8) || (_Var8 = square_isroom(c,lVar17), !_Var8)) ||
                        (_Var8 = square_isglow(c,lVar17), !_Var8)) ||
                       (_Var8 = source_can_light_wall(c,p,(loc_conflict)lVar17,(loc_conflict)lVar15)
                       , !_Var8)) goto LAB_0012a027;
                  }
                }
                else {
                  uVar20 = (ulong)lVar17 & 0xffffffff;
                  uVar22 = (ulong)lVar15 & 0xffffffff00000000;
                  if (((ulong)lVar17 ^ (ulong)lVar15) >> 0x20 == 0) {
                    lVar17 = (loc)(uVar22 - 0x100000000 | uVar20);
                    _Var8 = square_in_bounds(c,lVar17);
                    if (((!_Var8) || (_Var8 = square_allowslos(c,lVar17), !_Var8)) ||
                       ((_Var8 = square_isroom(c,lVar17), !_Var8 ||
                        ((_Var8 = square_isglow(c,lVar17), !_Var8 ||
                         (_Var8 = source_can_light_wall
                                            (c,p,(loc_conflict)lVar17,(loc_conflict)lVar15), !_Var8)
                         ))))) {
                      lVar17 = (loc)(uVar20 + uVar22 + 0x100000000);
                      goto LAB_00129f7a;
                    }
                  }
                  else {
                    lVar17 = (loc)(uVar20 | uVar22);
                    _Var8 = square_allowslos(c,lVar17);
                    if ((((!_Var8) || (_Var8 = square_isroom(c,lVar17), !_Var8)) ||
                        (_Var8 = square_isglow(c,lVar17), !_Var8)) ||
                       (_Var8 = source_can_light_wall(c,p,(loc_conflict)lVar17,(loc_conflict)lVar15)
                       , !_Var8)) {
                      lVar17 = (loc)(uVar19 | (ulong)lVar15 & 0xffffffff);
                      goto LAB_00129fe3;
                    }
                  }
                }
              }
            }
          }
          else {
LAB_0012a027:
            iVar26 = 0;
          }
          c->squares[local_70][lVar31].light = iVar26;
          _Var8 = square_isbright(c,lVar15);
          if (_Var8) {
            piVar2 = &c->squares[local_70][lVar31].light;
            *piVar2 = *piVar2 + 2;
            lVar30 = 0;
            do {
              lVar17 = (loc)loc_sum((loc_conflict)lVar15,(loc_conflict)ddgrid_ddd[lVar30]);
              _Var8 = square_in_bounds(c,lVar17);
              if ((_Var8) &&
                 ((_Var8 = square_allowslos(c,lVar17), _Var8 ||
                  (_Var8 = source_can_light_wall(c,p,(loc_conflict)lVar15,(loc_conflict)lVar17),
                  _Var8)))) {
                piVar2 = &c->squares[(long)lVar17 >> 0x20][lVar17.x].light;
                *piVar2 = *piVar2 + 1;
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != 8);
          }
          lVar31 = lVar31 + 1;
          uVar19 = (ulong)c->width;
        } while (lVar31 < (long)uVar19);
        iVar26 = c->height;
      }
      local_70 = local_70 + 1;
    } while (local_70 < iVar26);
  }
  add_light(c,p,p->grid,wVar13 + L'\xffffffff',wVar12);
  wVar12 = cave_monster_max(c);
  if (L'\x01' < wVar12) {
    wVar12 = L'\x01';
    do {
      mon = cave_monster(c,wVar12);
      if ((mon->race != (monster_race *)0x0) && (_Var7 = monster_is_camouflaged(mon), !_Var7)) {
        wVar13 = mon->race->light;
        wVar11 = -wVar13;
        if (L'\0' < wVar13) {
          wVar11 = wVar13;
        }
        if (wVar13 != L'\0') {
          lVar18 = mon->grid;
          uVar28 = lVar18.y - (p->grid).y;
          uVar4 = -uVar28;
          if (0 < (int)uVar28) {
            uVar4 = uVar28;
          }
          uVar29 = lVar18.x - (p->grid).x;
          uVar28 = -uVar29;
          if (0 < (int)uVar29) {
            uVar28 = uVar29;
          }
          iVar26 = (uVar4 >> 1) + uVar28;
          if (uVar28 < uVar4) {
            iVar26 = (uVar28 >> 1) + uVar4;
          }
          if (iVar26 - (wVar11 + L'\xffffffff') <= (int)(uint)z_info->max_sight) {
            add_light(c,p,lVar18,wVar11 + L'\xffffffff',wVar13);
          }
        }
      }
      wVar12 = wVar12 + L'\x01';
      wVar13 = cave_monster_max(c);
    } while (wVar12 < wVar13);
  }
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  wVar12 = square_light(c,grid);
  if (wVar12 != wVar10) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x2000000;
  }
  grid_00.x = (p->grid).x;
  grid_00.y = (p->grid).y;
  psVar16 = square(c,grid_00);
  flag_on_dbg(psVar16->info,3,6,"square(c, p->grid)->info","SQUARE_VIEW");
  if ((((L'\0' < (p->state).cur_light) ||
       (grid_01.x = (p->grid).x, grid_01.y = (p->grid).y, _Var7 = square_islit(c,grid_01), _Var7))
      || (_Var7 = flag_has_dbg((p->state).pflags,10,0x1f,"p->state.pflags","(PF_UNLIGHT)"), _Var7))
     || (_Var7 = player_of_has(p,L'+'), _Var7)) {
    grid_02.x = (p->grid).x;
    grid_02.y = (p->grid).y;
    psVar16 = square(c,grid_02);
    flag_on_dbg(psVar16->info,3,5,"square(c, p->grid)->info","SQUARE_SEEN");
    grid_03.x = (p->grid).x;
    grid_03.y = (p->grid).y;
    psVar16 = square(c,grid_03);
    flag_on_dbg(psVar16->info,3,0x15,"square(c, p->grid)->info","SQUARE_CLOSE_PLAYER");
  }
  if (((p->timed[2] != 0) &&
      (grid_04.x = (p->grid).x, grid_04.y = (p->grid).y, _Var7 = square_isknown(c,grid_04), _Var7))
     && (grid_05.x = (p->grid).x, grid_05.y = (p->grid).y,
        _Var7 = square_ispassable((chunk_conflict *)p->cave,grid_05), !_Var7)) {
    grid_06.x = (p->grid).x;
    grid_06.y = (p->grid).y;
    square_forget(c,grid_06);
  }
  iVar26 = c->height;
  if (0 < iVar26) {
    iVar9 = c->width;
    iVar23 = 0;
    do {
      if (0 < iVar9) {
        iVar26 = 0;
        do {
          lVar15 = (loc)loc(iVar26,iVar23);
          wVar12 = lVar15.y;
          uVar28 = (p->grid).y - wVar12;
          uVar4 = -uVar28;
          if (0 < (int)uVar28) {
            uVar4 = uVar28;
          }
          wVar13 = lVar15.x;
          uVar29 = (p->grid).x - wVar13;
          uVar28 = -uVar29;
          if (0 < (int)uVar29) {
            uVar28 = uVar29;
          }
          wVar10 = (uVar4 >> 1) + uVar28;
          if (uVar28 < uVar4) {
            wVar10 = (uVar28 >> 1) + uVar4;
          }
          if ((uint)wVar10 <= (uint)z_info->max_sight) {
            wVar11 = (p->state).cur_light;
            _Var7 = flag_has_dbg((p->state).pflags,10,0x1f,"p->state.pflags","(PF_UNLIGHT)");
            if (((_Var7) || (_Var7 = player_of_has(p,L'+'), _Var7)) &&
               (wVar27 = (p->state).cur_light, wVar27 < L'\x02')) {
              wVar11 = (short)(p->lev / 6 + 2) - wVar27;
            }
            _Var7 = square_allowslos(c,lVar15);
            lVar25 = lVar15;
            wVar27 = wVar12;
            if (!_Var7) {
              wVar27 = (p->grid).y;
              iVar14 = wVar12 - wVar27;
              wVar3 = (p->grid).x;
              iVar9 = -(uint)(wVar27 < wVar12);
              if (wVar12 < wVar27) {
                iVar9 = 1;
              }
              iVar24 = -(uint)(wVar3 < wVar13);
              iVar21 = wVar13 - wVar3;
              if (wVar13 < wVar3) {
                iVar24 = 1;
              }
              iVar5 = -iVar21;
              if (0 < iVar21) {
                iVar5 = iVar21;
              }
              iVar6 = -iVar14;
              if (0 < iVar14) {
                iVar6 = iVar14;
              }
              iVar21 = (uint)(0 < iVar21) * 2 + -1;
              iVar14 = (uint)(0 < iVar14) * 2 + -1;
              lVar25.x = iVar24 + wVar13;
              lVar17 = (loc)loc(lVar25.x,iVar9 + wVar12);
              _Var7 = square_allowslos(c,lVar17);
              wVar27 = iVar9 + wVar12;
              if (!_Var7) {
                wVar27 = wVar12;
              }
              lVar25.y = L'\0';
              if (!_Var7) {
                lVar25 = (loc)((ulong)lVar15 & 0xffffffff);
              }
              if (iVar6 == 1 && iVar5 == 2) {
                iVar21 = wVar13 - iVar21;
                lVar17 = (loc)loc(iVar21,wVar12);
                _Var7 = square_allowslos(c,lVar17);
                if (_Var7) {
                  lVar17 = (loc)loc(iVar21,wVar12 - iVar14);
LAB_0012a5a0:
                  _Var7 = square_allowslos(c,lVar17);
                  if (!_Var7) {
                    lVar25 = (loc)((ulong)lVar15 & 0xffffffff);
                    wVar27 = wVar12;
                  }
                }
              }
              else if (iVar6 == 2 && iVar5 == 1) {
                iVar14 = wVar12 - iVar14;
                lVar17 = (loc)loc(wVar13,iVar14);
                _Var7 = square_allowslos(c,lVar17);
                if (_Var7) {
                  lVar17 = (loc)loc(wVar13 - iVar21,iVar14);
                  goto LAB_0012a5a0;
                }
              }
            }
            lVar18 = loc(lVar25.x,wVar27);
            _Var7 = los(c,p->grid,lVar18);
            if ((_Var7) && (_Var7 = square_isview(c,lVar15), !_Var7)) {
              psVar16 = square(c,lVar15);
              flag_on_dbg(psVar16->info,3,6,"square(c, grid)->info","SQUARE_VIEW");
              if (wVar10 < wVar11) {
                psVar16 = square(c,lVar15);
                flag_on_dbg(psVar16->info,3,5,"square(c, grid)->info","SQUARE_SEEN");
                psVar16 = square(c,lVar15);
                flag_on_dbg(psVar16->info,3,0x15,"square(c, grid)->info","SQUARE_CLOSE_PLAYER");
              }
              _Var7 = square_islit(c,lVar15);
              if (_Var7) {
                _Var7 = square_allowslos(c,lVar15);
                if (!_Var7) {
                  wVar10 = (p->grid).x;
                  wVar11 = (p->grid).y;
                  iVar9 = -(uint)(wVar11 < wVar12);
                  if (wVar12 < wVar11) {
                    iVar9 = 1;
                  }
                  iVar14 = -(uint)(wVar10 < wVar13);
                  if (wVar13 < wVar10) {
                    iVar14 = 1;
                  }
                  lVar17 = (loc)loc(iVar14 + wVar13,iVar9 + wVar12);
                  _Var7 = square_islit(c,lVar17);
                  if (!_Var7) goto LAB_0012a741;
                }
                psVar16 = square(c,lVar15);
                flag_on_dbg(psVar16->info,3,5,"square(c, grid)->info","SQUARE_SEEN");
              }
            }
          }
LAB_0012a741:
          iVar26 = iVar26 + 1;
          iVar9 = c->width;
        } while (iVar26 < iVar9);
        iVar26 = c->height;
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 < iVar26);
    if (0 < iVar26) {
      iVar9 = c->width;
      iVar23 = 0;
      do {
        if (0 < iVar9) {
          iVar26 = 0;
          do {
            lVar15 = (loc)loc(iVar26,iVar23);
            if (p->timed[2] == 0) {
              _Var7 = square_isseen(c,lVar15);
              if (_Var7) {
                square_reveal_trap((chunk *)c,lVar15,false,true);
              }
            }
            else {
              psVar16 = square(c,lVar15);
              flag_off(psVar16->info,3,5);
              psVar16 = square(c,lVar15);
              flag_off(psVar16->info,3,0x15);
            }
            _Var7 = square_isseen(c,lVar15);
            if ((_Var7) && (_Var7 = square_wasseen(c,lVar15), !_Var7)) {
              _Var7 = square_isfeel(c,lVar15);
              if (_Var7) {
                c->feeling_squares = c->feeling_squares + 1;
                psVar16 = square(c,lVar15);
                flag_off(psVar16->info,3,8);
                if (((ushort)(byte)c->feeling_squares == z_info->feeling_need) &&
                   (p->upkeep->only_partial == false)) {
                  display_feeling(true);
                  puVar1 = &p->upkeep->redraw;
                  *puVar1 = *puVar1 | 0x1000000;
                }
              }
              square_note_spot((chunk *)c,lVar15);
              square_light_spot((chunk *)c,lVar15);
            }
            _Var7 = square_isseen(c,lVar15);
            if ((!_Var7) && (_Var7 = square_wasseen(c,lVar15), _Var7)) {
              square_light_spot((chunk *)c,lVar15);
            }
            psVar16 = square(c,lVar15);
            flag_off(psVar16->info,3,7);
            iVar26 = iVar26 + 1;
            iVar9 = c->width;
          } while (iVar26 < iVar9);
          iVar26 = c->height;
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 < iVar26);
    }
  }
  return;
}

Assistant:

void update_view(struct chunk *c, struct player *p)
{
	int x, y;

	/* Record the current view */
	mark_wasseen(c);

	/* Calculate light levels */
	calc_lighting(c, p);

	/* Assume we can view the player grid */
	sqinfo_on(square(c, p->grid)->info, SQUARE_VIEW);
	if (p->state.cur_light > 0 || square_islit(c, p->grid) ||
		player_has(p, PF_UNLIGHT) || player_of_has(p, OF_DARKNESS)) {
		sqinfo_on(square(c, p->grid)->info, SQUARE_SEEN);
		sqinfo_on(square(c, p->grid)->info, SQUARE_CLOSE_PLAYER);
	}
	/*
	 * If the player is blind and in terrain that was remembered to be
	 * impassable, forget the remembered terrain.  This will have to be
	 * modified in variants that have timed effects which allow a player
	 * to move through impassable terrain.
	 */
	if (p->timed[TMD_BLIND] && square_isknown(c, p->grid)
			&& !square_ispassable(p->cave, p->grid)) {
		square_forget(c, p->grid);
	}

	/* Squares we have LOS to get marked as in the view, and perhaps seen */
	for (y = 0; y < c->height; y++)
		for (x = 0; x < c->width; x++)
			update_view_one(c, loc(x, y), p);

	/* Update each grid */
	for (y = 0; y < c->height; y++)
		for (x = 0; x < c->width; x++)
			update_one(c, loc(x, y), p);
}